

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSExporter::WriteColor(Discreet3DSExporter *this,aiColor3D *color)

{
  undefined1 local_28 [8];
  ChunkWriter chunk;
  aiColor3D *color_local;
  Discreet3DSExporter *this_local;
  
  chunk.chunk_start_pos = (size_t)color;
  anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)local_28,&this->writer,0x10);
  StreamWriter<false,_false>::PutF4(&this->writer,*(float *)chunk.chunk_start_pos);
  StreamWriter<false,_false>::PutF4(&this->writer,*(float *)(chunk.chunk_start_pos + 4));
  StreamWriter<false,_false>::PutF4(&this->writer,*(float *)(chunk.chunk_start_pos + 8));
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)local_28);
  return;
}

Assistant:

void Discreet3DSExporter::WriteColor(const aiColor3D& color) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_RGBF);
    writer.PutF4(color.r);
    writer.PutF4(color.g);
    writer.PutF4(color.b);
}